

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetOutputRecordTest_Test::TestBody(Psbt_SetOutputRecordTest_Test *this)

{
  allocator<unsigned_char> *this_00;
  pointer *ppuVar1;
  pointer *this_01;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  reference pvVar6;
  uchar *puVar7;
  size_type sVar8;
  uchar *puVar9;
  uint *puVar10;
  char *pcVar11;
  reference pvVar12;
  char *in_R9;
  AssertHelper local_1360;
  Message local_1358;
  ByteData local_1350;
  string local_1338;
  undefined1 local_1318 [8];
  AssertionResult gtest_ar_10;
  undefined1 local_12f0 [8];
  ByteData output_bip32_key1;
  Message local_12d0;
  string local_12c8;
  undefined1 local_12a8 [8];
  AssertionResult gtest_ar_9;
  Message local_1290;
  string local_1288;
  string local_1268;
  undefined1 local_1248 [8];
  AssertionResult gtest_ar_8;
  Message local_1230;
  string local_1228;
  string local_1208;
  undefined1 local_11e8 [8];
  AssertionResult gtest_ar_7;
  Message local_11d0;
  size_type local_11c8;
  int local_11bc;
  undefined1 local_11b8 [8];
  AssertionResult gtest_ar_6;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  Message local_1188;
  string local_1180;
  string local_1160;
  undefined1 local_1140 [8];
  AssertionResult gtest_ar_5;
  Message local_1128;
  string local_1120;
  string local_1100;
  undefined1 local_10e0 [8];
  AssertionResult gtest_ar_4;
  ByteData get_gval2;
  ByteData get_gval1;
  Psbt local_1088;
  string local_1038;
  AssertHelper local_1018;
  Message local_1010;
  bool local_1001;
  undefined1 local_1000 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_fd0;
  Message local_fc8;
  bool local_fb9;
  undefined1 local_fb8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_f88;
  Message local_f80;
  bool local_f71;
  undefined1 local_f70 [8];
  AssertionResult gtest_ar_;
  string local_f58;
  undefined1 local_f38 [8];
  ByteData global_value2;
  string local_f18;
  allocator local_ef1;
  string local_ef0;
  undefined1 local_ed0 [8];
  ByteData global_key2;
  string local_eb0;
  undefined1 local_e90 [8];
  ByteData global_value1;
  string local_e70;
  allocator local_e49;
  string local_e48;
  undefined1 local_e28 [8];
  ByteData global_key1;
  Message local_e08;
  string local_e00;
  string local_de0;
  undefined1 local_dc0 [8];
  AssertionResult gtest_ar_3;
  Message local_da8;
  string local_da0;
  string local_d80;
  undefined1 local_d60 [8];
  AssertionResult gtest_ar_2;
  KeyData get_val2;
  KeyData get_val1;
  undefined1 local_a28 [8];
  Psbt psbt2;
  Message local_9d0;
  string local_9c8;
  undefined1 local_9a8 [8];
  AssertionResult gtest_ar_1;
  Message local_990;
  ByteData local_988;
  string local_970;
  undefined1 local_950 [8];
  AssertionResult gtest_ar;
  ByteData txout_value2;
  ByteData txout_key2;
  ByteData txout_value1;
  ByteData txout_key1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist1;
  undefined1 local_898 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp2;
  undefined1 local_868 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp1;
  ByteData local_838;
  undefined1 local_820 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes2;
  ByteData local_7f0;
  undefined1 local_7d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_val_bytes;
  undefined1 local_7a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_key_bytes;
  undefined1 local_770 [8];
  Address addr2;
  undefined1 local_5d8 [8];
  Address addr1;
  KeyData key2;
  KeyData key1;
  undefined1 local_140 [8];
  string path2;
  undefined1 local_118 [8];
  string path1;
  undefined1 local_e0 [8];
  HDWallet wallet2;
  undefined1 local_b0 [8];
  HDWallet wallet1;
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  Psbt psbt;
  Psbt_SetOutputRecordTest_Test *this_local;
  
  psbt.base_tx_.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,&local_81);
  cfd::core::Psbt::Psbt((Psbt *)local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet
            ((HDWallet *)local_b0,
             (ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)((long)&path1.field_2 + 8),&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_e0,(ByteData *)((long)&path1.field_2 + 8));
  cfd::core::ByteData::~ByteData((ByteData *)((long)&path1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_118,"44h/0h/0h/0/2",(allocator *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_140,"44h/0h/0h/0/2",
             (allocator *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_b0,kTestnet,
             (string *)local_118,kNormal);
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (HDWallet *)local_e0,kTestnet,(string *)local_140,kNormal);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Address::Address
            ((Address *)local_5d8,kCfdIllegalArgumentError,kVersion0,
             (Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::Address
            ((Address *)local_770,kCfdIllegalArgumentError,kVersion0,
             (Pubkey *)
             &txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = (allocator<unsigned_char> *)
            ((long)&txout_val_bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0,0x22,this_00);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&txout_val_bytes.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0,0);
  *pvVar6 = '\x02';
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Pubkey::GetData
            (&local_7f0,
             (Pubkey *)
             &pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7d8,&local_7f0);
  cfd::core::ByteData::~ByteData(&local_7f0);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)
             &fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Pubkey::GetData
            (&local_838,
             (Pubkey *)
             &fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_820,&local_838);
  cfd::core::ByteData::~ByteData(&local_838);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)
             &fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetFingerprint
            ((ByteData *)
             &fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_868,
             (ByteData *)
             &fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetFingerprint
            ((ByteData *)
             &plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::ByteData::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_898,
             (ByteData *)
             &plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetChildNumArray
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::KeyData::GetChildNumArray
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &txout_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7d8);
  pvVar6[0x20] = puVar7[0x20];
  uVar2 = *(undefined8 *)puVar7;
  uVar3 = *(undefined8 *)(puVar7 + 8);
  uVar4 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar4;
  *(undefined8 *)pvVar6 = uVar2;
  *(undefined8 *)(pvVar6 + 8) = uVar3;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,sVar8 * 4 + 4);
  ppuVar1 = &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_868);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar9;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  this_01 = &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
  memcpy(puVar7 + 4,puVar10,sVar8 << 2);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &txout_value1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &txout_key2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_820);
  pvVar6[0x20] = puVar7[0x20];
  uVar2 = *(undefined8 *)puVar7;
  uVar3 = *(undefined8 *)(puVar7 + 8);
  uVar4 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar4;
  *(undefined8 *)pvVar6 = uVar2;
  *(undefined8 *)(pvVar6 + 8) = uVar3;
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &txout_key1.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,sVar8 * 4 + 4);
  ppuVar1 = &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  puVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_898);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar9;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  ppuVar1 = &txout_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppuVar1);
  memcpy(puVar7 + 4,puVar10,sVar8 << 2);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &txout_value2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0);
  cfd::core::ByteData::ByteData
            ((ByteData *)&gtest_ar.message_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::SetTxOutRecord
            ((Psbt *)local_60,0,
             (ByteData *)
             &txout_value1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (ByteData *)
             &txout_key2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::SetTxOutRecord
            ((Psbt *)local_60,1,
             (ByteData *)
             &txout_value2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)&gtest_ar.message_);
  cfd::core::Psbt::GetData(&local_988,(Psbt *)local_60);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_970,&local_988);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_950,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_970);
  cfd::core::ByteData::~ByteData(&local_988);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_950);
  if (!bVar5) {
    testing::Message::Message(&local_990);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_950);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3df,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_990);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_990);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_950);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_9c8,(Psbt *)local_60);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_9a8,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_9c8);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a8);
  if (!bVar5) {
    testing::Message::Message(&local_9d0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_9a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3e0,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_9d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_9d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a8);
  cfd::core::Psbt::GetData
            ((ByteData *)
             &get_val1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Psbt *)local_60);
  cfd::core::Psbt::Psbt
            ((Psbt *)local_a28,
             (ByteData *)
             &get_val1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_val1.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxOutKeyData
            ((KeyData *)
             &get_val2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(Psbt *)local_a28,0,false);
  cfd::core::Psbt::GetTxOutKeyData((KeyData *)&gtest_ar_2.message_,(Psbt *)local_a28,1,false);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_d80,
             (KeyData *)
             &get_val2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_da0,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_d60,"get_val1.ToString()","key1.ToString()",&local_d80,
             &local_da0);
  std::__cxx11::string::~string((string *)&local_da0);
  std::__cxx11::string::~string((string *)&local_d80);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d60);
  if (!bVar5) {
    testing::Message::Message(&local_da8);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_d60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3e5,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_da8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d60);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_de0,(KeyData *)&gtest_ar_2.message_,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_
            (&local_e00,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             true,kApostrophe,false);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_dc0,"get_val2.ToString()","key2.ToString()",&local_de0,
             &local_e00);
  std::__cxx11::string::~string((string *)&local_e00);
  std::__cxx11::string::~string((string *)&local_de0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dc0);
  if (!bVar5) {
    testing::Message::Message(&local_e08);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_dc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3e6,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_e08);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_e08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e48,"cfd",&local_e49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e70,"dummy1",
             (allocator *)
             ((long)&global_value1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Psbt::CreateRecordKey((ByteData *)local_e28,0xfc,&local_e48,'\0',&local_e70);
  std::__cxx11::string::~string((string *)&local_e70);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_value1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_e48);
  std::allocator<char>::~allocator((allocator<char> *)&local_e49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_eb0,"01020304",
             (allocator *)
             ((long)&global_key2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_e90,&local_eb0);
  std::__cxx11::string::~string((string *)&local_eb0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_key2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ef0,"cfd",&local_ef1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f18,"dummy2",
             (allocator *)
             ((long)&global_value2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Psbt::CreateRecordKey((ByteData *)local_ed0,0xfc,&local_ef0,'\0',&local_f18);
  std::__cxx11::string::~string((string *)&local_f18);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&global_value2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_ef0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ef1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f58,"00",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_f38,&local_f58);
  std::__cxx11::string::~string((string *)&local_f58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::Psbt::SetTxOutRecord((Psbt *)local_60,0,(ByteData *)local_e28,(ByteData *)local_e90);
  local_f71 = cfd::core::Psbt::IsFindTxOutRecord((Psbt *)local_60,0,(ByteData *)local_e28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f70,&local_f71,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f70);
  if (!bVar5) {
    testing::Message::Message(&local_f80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_f70,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key1)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3ed,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f88,&local_f80);
    testing::internal::AssertHelper::~AssertHelper(&local_f88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_f80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f70);
  bVar5 = cfd::core::Psbt::IsFindTxOutRecord((Psbt *)local_60,0,(ByteData *)local_ed0);
  local_fb9 = (bool)(~bVar5 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fb8,&local_fb9,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fb8);
  if (!bVar5) {
    testing::Message::Message(&local_fc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_fb8,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","true","false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3ee,pcVar11);
    testing::internal::AssertHelper::operator=(&local_fd0,&local_fc8);
    testing::internal::AssertHelper::~AssertHelper(&local_fd0);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_fc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fb8);
  cfd::core::Psbt::SetTxOutRecord((Psbt *)local_60,0,(ByteData *)local_ed0,(ByteData *)local_f38);
  local_1001 = cfd::core::Psbt::IsFindTxOutRecord((Psbt *)local_60,0,(ByteData *)local_ed0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1000,&local_1001,(type *)0x0);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1000);
  if (!bVar5) {
    testing::Message::Message(&local_1010);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1038,(internal *)local_1000,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3f0,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1018,&local_1010);
    testing::internal::AssertHelper::~AssertHelper(&local_1018);
    std::__cxx11::string::~string((string *)&local_1038);
    testing::Message::~Message(&local_1010);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1000);
  cfd::core::Psbt::GetData
            ((ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_60);
  cfd::core::Psbt::Psbt
            (&local_1088,
             (ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::operator=((Psbt *)local_a28,&local_1088);
  cfd::core::Psbt::~Psbt(&local_1088);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_gval1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::GetTxOutRecord
            ((ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_a28,0,
             (ByteData *)local_e28);
  cfd::core::Psbt::GetTxOutRecord
            ((ByteData *)&gtest_ar_4.message_,(Psbt *)local_a28,0,(ByteData *)local_ed0);
  cfd::core::ByteData::GetHex_abi_cxx11_
            (&local_1100,
             (ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1120,(ByteData *)local_e90);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_10e0,"get_gval1.GetHex()","global_value1.GetHex()",&local_1100
             ,&local_1120);
  std::__cxx11::string::~string((string *)&local_1120);
  std::__cxx11::string::~string((string *)&local_1100);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e0);
  if (!bVar5) {
    testing::Message::Message(&local_1128);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_10e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3f5,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1160,(ByteData *)&gtest_ar_4.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1180,(ByteData *)local_f38);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1140,"get_gval2.GetHex()","global_value2.GetHex()",&local_1160
             ,&local_1180);
  std::__cxx11::string::~string((string *)&local_1180);
  std::__cxx11::string::~string((string *)&local_1160);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1140);
  if (!bVar5) {
    testing::Message::Message(&local_1188);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3f6,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1188);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &key_list.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1140);
  cfd::core::Psbt::GetTxOutRecordKeyList
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_,(Psbt *)local_a28,0);
  local_11bc = 2;
  local_11c8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                          &gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_11b8,"2","key_list.size()",&local_11bc,&local_11c8);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11b8);
  if (!bVar5) {
    testing::Message::Message(&local_11d0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_11b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3f9,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_11d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_11d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11b8);
  sVar8 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &gtest_ar_6.message_);
  if (sVar8 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1208,(ByteData *)local_e28);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &gtest_ar_6.message_,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1228,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_11e8,"global_key1.GetHex()","key_list[0].GetHex()",
               &local_1208,&local_1228);
    std::__cxx11::string::~string((string *)&local_1228);
    std::__cxx11::string::~string((string *)&local_1208);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11e8);
    if (!bVar5) {
      testing::Message::Message(&local_1230);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_11e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
                 ,0x3fb,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1230);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_1230);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_11e8);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1268,(ByteData *)local_ed0);
    pvVar12 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &gtest_ar_6.message_,1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1288,pvVar12);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_1248,"global_key2.GetHex()","key_list[1].GetHex()",
               &local_1268,&local_1288);
    std::__cxx11::string::~string((string *)&local_1288);
    std::__cxx11::string::~string((string *)&local_1268);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1248);
    if (!bVar5) {
      testing::Message::Message(&local_1290);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1248);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
                 ,0x3fc,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1290);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_1290);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1248);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_12c8,(Psbt *)local_a28);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_12a8,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
             ,pcVar11);
  std::__cxx11::string::~string((string *)&local_12c8);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12a8);
  if (!bVar5) {
    testing::Message::Message(&local_12d0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_12a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &output_bip32_key1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x3fe,pcVar11);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &output_bip32_key1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_12d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &output_bip32_key1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_12d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12a8);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)&gtest_ar_10.message_,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::CreatePubkeyRecordKey
            ((ByteData *)local_12f0,'\x02',(Pubkey *)&gtest_ar_10.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)&gtest_ar_10.message_);
  cfd::core::Psbt::GetTxOutRecord(&local_1350,(Psbt *)local_a28,0,(ByteData *)local_12f0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1338,&local_1350);
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1318,"\"2a7047602c00008000000080000000800000000002000000\"",
             "psbt2.GetTxOutRecord(0, output_bip32_key1).GetHex().c_str()",
             "2a7047602c00008000000080000000800000000002000000",pcVar11);
  std::__cxx11::string::~string((string *)&local_1338);
  cfd::core::ByteData::~ByteData(&local_1350);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1318);
  if (!bVar5) {
    testing::Message::Message(&local_1358);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)local_1318);
    testing::internal::AssertHelper::AssertHelper
              (&local_1360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_psbt.cpp"
               ,0x404,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1360,&local_1358);
    testing::internal::AssertHelper::~AssertHelper(&local_1360);
    testing::Message::~Message(&local_1358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1318);
  cfd::core::ByteData::~ByteData((ByteData *)local_12f0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_4.message_);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &get_gval2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData((ByteData *)local_f38);
  cfd::core::ByteData::~ByteData((ByteData *)local_ed0);
  cfd::core::ByteData::~ByteData((ByteData *)local_e90);
  cfd::core::ByteData::~ByteData((ByteData *)local_e28);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar_2.message_);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &get_val2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::~Psbt((Psbt *)local_a28);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &txout_value2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &txout_key2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &txout_value1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &txout_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_898);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_868);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_820);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_7a0);
  cfd::core::Address::~Address((Address *)local_770);
  cfd::core::Address::~Address((Address *)local_5d8);
  cfd::core::KeyData::~KeyData
            ((KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_118);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_e0);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_b0);
  cfd::core::Psbt::~Psbt((Psbt *)local_60);
  return;
}

Assistant:

TEST(Psbt, SetOutputRecordTest) {
  Psbt psbt("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  std::vector<uint8_t> txout_key_bytes(34);
  std::vector<uint8_t> txout_val_bytes;
  txout_key_bytes[0] = 2;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txout_key_bytes[1], pk_bytes1.data(), 33);
  txout_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txout_val_bytes.data(), fp1.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txout_key_bytes);
  ByteData txout_value1 = ByteData(txout_val_bytes);

  memcpy(&txout_key_bytes[1], pk_bytes2.data(), 33);
  txout_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txout_val_bytes.data(), fp2.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txout_key_bytes);
  ByteData txout_value2 = ByteData(txout_val_bytes);

  psbt.SetTxOutRecord(0, txout_key1, txout_value1);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(0, txout_key1));
  // EXPECT_FALSE(psbt.IsFindTxOutRecord(1, txout_key2));
  psbt.SetTxOutRecord(1, txout_key2, txout_value2);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(1, txout_key2));

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxOutKeyData(0);
  auto get_val2 = psbt2.GetTxOutKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxOutRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxOutRecord(0, global_key2));
  psbt.SetTxOutRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxOutRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxOutRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxOutRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", psbt2.GetBase64().c_str());

  ByteData output_bip32_key1 = Psbt::CreatePubkeyRecordKey(
      Psbt::kPsbtOutputBip32Derivation, key1.GetPubkey());
  EXPECT_STREQ(
      "2a7047602c00008000000080000000800000000002000000",
      psbt2.GetTxOutRecord(0, output_bip32_key1).GetHex().c_str());
}